

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::
     map_slot_policy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
     ::
     transfer<std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
               (scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *alloc_local;
  
  map_slot_policy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
  ::emplace(new_slot);
  allocator_traits<std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
  ::
  construct<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>>
            (alloc,&new_slot->value,&old_slot->value);
  destroy<std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
            (alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }